

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsKeyPressed(int user_key_index,bool repeat)

{
  float t1;
  float repeat_delay;
  bool bVar1;
  int iVar2;
  ImGuiContext *g;
  float t;
  
  if (user_key_index < 0) {
    return false;
  }
  t1 = (GImGui->IO).KeysDownDuration[(uint)user_key_index];
  bVar1 = t1 == 0.0;
  if (repeat && !bVar1) {
    repeat_delay = (GImGui->IO).KeyRepeatDelay;
    if (t1 <= repeat_delay) {
      return false;
    }
    iVar2 = CalcTypematicRepeatAmount
                      (t1 - (GImGui->IO).DeltaTime,t1,repeat_delay,(GImGui->IO).KeyRepeatRate);
    bVar1 = 0 < iVar2;
  }
  return bVar1;
}

Assistant:

bool ImGui::IsKeyPressed(int user_key_index, bool repeat)
{
    ImGuiContext& g = *GImGui;
    if (user_key_index < 0)
        return false;
    IM_ASSERT(user_key_index >= 0 && user_key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    const float t = g.IO.KeysDownDuration[user_key_index];
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return GetKeyPressedAmount(user_key_index, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}